

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void tinygltf::SerializeStringProperty(string *key,string *value,json *obj)

{
  char *key_00;
  char *s;
  json local_30;
  json *local_20;
  json *obj_local;
  string *value_local;
  string *key_local;
  
  local_20 = obj;
  obj_local = (json *)value;
  value_local = key;
  key_00 = (char *)std::__cxx11::string::c_str();
  s = (char *)std::__cxx11::string::c_str();
  detail::JsonFromString_abi_cxx11_((detail *)&local_30,s);
  detail::JsonAddMember(obj,key_00,&local_30);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_30);
  return;
}

Assistant:

static void SerializeStringProperty(const std::string &key,
                                    const std::string &value,
                                    detail::json &obj) {
  detail::JsonAddMember(obj, key.c_str(),
                        detail::JsonFromString(value.c_str()));
}